

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void statAccumDestructor(void *pOld)

{
  sqlite3 *in_RDI;
  StatAccum *p;
  void *in_stack_ffffffffffffffe8;
  
  sqlite3DbFree(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void statAccumDestructor(void *pOld){
  StatAccum *p = (StatAccum*)pOld;
#ifdef SQLITE_ENABLE_STAT4
  if( p->mxSample ){
    int i;
    for(i=0; i<p->nCol; i++) sampleClear(p->db, p->aBest+i);
    for(i=0; i<p->mxSample; i++) sampleClear(p->db, p->a+i);
    sampleClear(p->db, &p->current);
  }
#endif
  sqlite3DbFree(p->db, p);
}